

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test::
TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test
          (TEST_MemoryLeakWarningGlobalDetectorTest_turnOffNewOverloadsCausesNoAdditionalLeaks_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalNewAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalNewArrayAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter =
       (MemoryLeakFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).memoryAllocatorStash.
  originalMallocAllocator = (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).failureReporter =
       (MemoryLeakFailure *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyDetector =
       (DummyMemoryLeakDetector *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).detector =
       (MemoryLeakDetector *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)&PTR__Utest_0034f350;
  GlobalMemoryAllocatorStash::GlobalMemoryAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              memoryAllocatorStash);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).super_Utest._vptr_Utest
       = (_func_int **)&PTR__Utest_0034e130;
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, turnOffNewOverloadsCausesNoAdditionalLeaks)
{
    size_t storedAmountOfLeaks = detector->totalMemoryLeaks(mem_leak_period_all);

    char* arrayMemory = new char[100];
    char* nonArrayMemory = new char;
    char* mallocMemory = (char*) cpputest_malloc_location_with_leak_detection(10, "file", 10);
    char* reallocMemory = (char*) cpputest_realloc_location_with_leak_detection(NULLPTR, 10, "file", 10);

    LONGS_EQUAL(storedAmountOfLeaks, detector->totalMemoryLeaks(mem_leak_period_all));

    cpputest_free_location_with_leak_detection(mallocMemory, "file", 10);
    cpputest_free_location_with_leak_detection(reallocMemory, "file", 10);
    delete [] arrayMemory;
    delete nonArrayMemory;
}